

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::LoopDependenceAnalysis::IsProvablyOutsideOfLoopBounds
          (LoopDependenceAnalysis *this,Loop *loop,SENode *distance,SENode *coefficient)

{
  int iVar1;
  undefined4 extraout_var;
  int64_t iVar2;
  SENode *pSVar3;
  undefined4 extraout_var_00;
  allocator<char> local_159;
  string local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  SEConstantNode *local_f8;
  SEConstantNode *distance_minus_bounds;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  SENode *local_a0;
  SENode *bounds;
  string local_90;
  SENode *local_70;
  SENode *upper_bound;
  SENode *lower_bound;
  string local_58;
  SEConstantNode *local_38;
  SEConstantNode *coefficient_constant;
  SENode *coefficient_local;
  SENode *distance_local;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  coefficient_constant = (SEConstantNode *)coefficient;
  coefficient_local = distance;
  distance_local = (SENode *)loop;
  loop_local = (Loop *)this;
  iVar1 = (*coefficient->_vptr_SENode[4])();
  local_38 = (SEConstantNode *)CONCAT44(extraout_var,iVar1);
  if (local_38 == (SEConstantNode *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "IsProvablyOutsideOfLoopBounds could not reduce coefficient to a SEConstantNode so must exit."
               ,(allocator<char> *)((long)&lower_bound + 7));
    PrintDebug(this,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&lower_bound + 7));
  }
  else {
    upper_bound = GetLowerBound(this,(Loop *)distance_local);
    local_70 = GetUpperBound(this,(Loop *)distance_local);
    if ((upper_bound == (SENode *)0x0) || (local_70 == (SENode *)0x0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,
                 "IsProvablyOutsideOfLoopBounds could not get both the lower and upper bounds so must exit."
                 ,(allocator<char> *)((long)&bounds + 7));
      PrintDebug(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&bounds + 7));
    }
    else {
      local_a0 = (SENode *)0x0;
      iVar2 = SEConstantNode::FoldToSingleValue(local_38);
      if (iVar2 < 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,
                   "IsProvablyOutsideOfLoopBounds found coefficient < 0.\nUsing bounds as lower - upper."
                   ,(allocator<char> *)((long)&distance_minus_bounds + 7));
        PrintDebug(this,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&distance_minus_bounds + 7));
        pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                           (&this->scalar_evolution_,upper_bound,local_70);
        local_a0 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,
                   "IsProvablyOutsideOfLoopBounds found coefficient >= 0.\nUsing bounds as upper - lower."
                   ,&local_c1);
        PrintDebug(this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
        pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                           (&this->scalar_evolution_,local_70,upper_bound);
        local_a0 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
      }
      pSVar3 = ScalarEvolutionAnalysis::CreateSubtraction
                         (&this->scalar_evolution_,coefficient_local,local_a0);
      pSVar3 = ScalarEvolutionAnalysis::SimplifyExpression(&this->scalar_evolution_,pSVar3);
      iVar1 = (*pSVar3->_vptr_SENode[4])();
      local_f8 = (SEConstantNode *)CONCAT44(extraout_var_00,iVar1);
      if (local_f8 != (SEConstantNode *)0x0) {
        iVar2 = SEConstantNode::FoldToSingleValue(local_f8);
        ToString<long>(&local_138,this,iVar2);
        std::operator+(&local_118,
                       "IsProvablyOutsideOfLoopBounds found distance - bounds as a SEConstantNode with value "
                       ,&local_138);
        PrintDebug(this,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)&local_138);
        iVar2 = SEConstantNode::FoldToSingleValue(local_f8);
        if (0 < iVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_158,
                     "IsProvablyOutsideOfLoopBounds found distance escaped the loop bounds.",
                     &local_159);
          PrintDebug(this,&local_158);
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool LoopDependenceAnalysis::IsProvablyOutsideOfLoopBounds(
    const Loop* loop, SENode* distance, SENode* coefficient) {
  // We test to see if we can reduce the coefficient to an integral constant.
  SEConstantNode* coefficient_constant = coefficient->AsSEConstantNode();
  if (!coefficient_constant) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds could not reduce coefficient to a "
        "SEConstantNode so must exit.");
    return false;
  }

  SENode* lower_bound = GetLowerBound(loop);
  SENode* upper_bound = GetUpperBound(loop);
  if (!lower_bound || !upper_bound) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds could not get both the lower and upper "
        "bounds so must exit.");
    return false;
  }
  // If the coefficient is positive we calculate bounds as upper - lower
  // If the coefficient is negative we calculate bounds as lower - upper
  SENode* bounds = nullptr;
  if (coefficient_constant->FoldToSingleValue() >= 0) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found coefficient >= 0.\n"
        "Using bounds as upper - lower.");
    bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(upper_bound, lower_bound));
  } else {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found coefficient < 0.\n"
        "Using bounds as lower - upper.");
    bounds = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.CreateSubtraction(lower_bound, upper_bound));
  }

  // We can attempt to deal with symbolic cases by subtracting |distance| and
  // the bound nodes. If we can subtract, simplify and produce a SEConstantNode
  // we can produce some information.
  SEConstantNode* distance_minus_bounds =
      scalar_evolution_
          .SimplifyExpression(
              scalar_evolution_.CreateSubtraction(distance, bounds))
          ->AsSEConstantNode();
  if (distance_minus_bounds) {
    PrintDebug(
        "IsProvablyOutsideOfLoopBounds found distance - bounds as a "
        "SEConstantNode with value " +
        ToString(distance_minus_bounds->FoldToSingleValue()));
    // If distance - bounds > 0 we prove the distance is outwith the loop
    // bounds.
    if (distance_minus_bounds->FoldToSingleValue() > 0) {
      PrintDebug(
          "IsProvablyOutsideOfLoopBounds found distance escaped the loop "
          "bounds.");
      return true;
    }
  }

  return false;
}